

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicTexImage3DCase::createTexture(BasicTexImage3DCase *this)

{
  ContextWrapper *this_00;
  Vec4 *maxVal;
  TextureFormatInfo *minVal;
  deUint32 dVar1;
  byte bVar2;
  int depth;
  int width;
  int height;
  int level;
  deUint32 tex;
  BasicTexImage3DCase *local_e0;
  ContextWrapper *local_d8;
  ulong local_d0;
  TransferFormat local_c8;
  Vec4 *local_c0;
  TextureFormatInfo *local_b8;
  TextureLevel levelData;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_58;
  
  tex = 0;
  dVar1 = deStringHash((this->super_Texture3DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  local_c8 = glu::getTransferFormat((this->super_Texture3DSpecCase).m_texFormat);
  local_d0 = (ulong)local_c8 >> 0x20;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(local_c8.format,local_c8.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  this_00 = &(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x806f,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_b8 = &(this->super_Texture3DSpecCase).m_texFormatInfo;
  local_c0 = &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax;
  local_e0 = this;
  local_d8 = this_00;
  for (level = 0; minVal = local_b8, maxVal = local_c0,
      level < (local_e0->super_Texture3DSpecCase).m_numLevels; level = level + 1) {
    bVar2 = (byte)level;
    width = (local_e0->super_Texture3DSpecCase).m_width >> (bVar2 & 0x1f);
    if (width < 2) {
      width = 1;
    }
    height = (local_e0->super_Texture3DSpecCase).m_height >> (bVar2 & 0x1f);
    if (height < 2) {
      height = 1;
    }
    depth = (local_e0->super_Texture3DSpecCase).m_depth >> (bVar2 & 0x1f);
    if (depth < 2) {
      depth = 1;
    }
    randomVector<4>((Functional *)&gMin,&rnd,&local_b8->valueMin,local_c0);
    randomVector<4>((Functional *)&gMax,&rnd,&minVal->valueMin,maxVal);
    tcu::TextureLevel::setSize(&levelData,width,height,depth);
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    dVar1 = local_e0->m_internalFormat;
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    sglr::ContextWrapper::glTexImage3D
              (local_d8,0x806f,level,dVar1,width,height,depth,0,local_c8.format,(deUint32)local_d0,
               local_58.super_ConstPixelBufferAccess.m_data);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32				tex			= 0;
		de::Random				rnd			(deStringHash(getName()));
		glu::TransferFormat		transferFmt	= glu::getTransferFormat(m_texFormat);
		tcu::TextureLevel		levelData	(glu::mapGLTransferFormat(transferFmt.format, transferFmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width	>> ndx);
			int		levelH		= de::max(1, m_height	>> ndx);
			int		levelD		= de::max(1, m_depth	>> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH, levelD);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_3D, ndx, m_internalFormat, levelW, levelH, levelD, 0, transferFmt.format, transferFmt.dataType, levelData.getAccess().getDataPtr());
		}
	}